

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

uint __thiscall
chrono::fea::ChContactTriangleXYZROT::GetSubBlockOffset(ChContactTriangleXYZROT *this,int nblock)

{
  uint uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if (nblock == 2) {
    peVar2 = (this->mnode3).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode3).
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  }
  else if (nblock == 1) {
    peVar2 = (this->mnode2).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode2).
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  }
  else {
    if (nblock != 0) {
      return 0;
    }
    peVar2 = (this->mnode1).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode1).
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  uVar1 = *(uint *)((long)&(peVar2->super_ChNodeFEAbase).m_TotalMass +
                   (long)((peVar2->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return uVar1;
}

Assistant:

unsigned int ChContactTriangleXYZROT::GetSubBlockOffset(int nblock) {
    if (nblock == 0)
        return GetNode1()->NodeGetOffset_w();
    if (nblock == 1)
        return GetNode2()->NodeGetOffset_w();
    if (nblock == 2)
        return GetNode3()->NodeGetOffset_w();
    return 0;
}